

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_fini.c
# Opt level: O0

void mpt_path_fini(mpt_path *path)

{
  long *plVar1;
  mpt_buffer *buf;
  mpt_path *path_local;
  
  if ((path->flags & 0x40) != 0) {
    path->flags = path->flags & 0xbf;
    path->len = 0;
    path->off = 0;
    if (path->base != (char *)0x0) {
      plVar1 = (long *)(path->base + -0x20);
      (**(code **)(*plVar1 + 8))(plVar1);
      path->base = (char *)0x0;
    }
  }
  return;
}

Assistant:

extern void mpt_path_fini(MPT_STRUCT(path) *path)
{
	MPT_STRUCT(buffer) *buf;
	
	if (!(path->flags & MPT_PATHFLAG(HasArray))) {
		return;
	}
	path->flags &= ~MPT_PATHFLAG(HasArray);
	path->off = path->len = 0;
	
	if (!(buf = (void *) path->base)) {
		return;
	}
	--buf;
	buf->_vptr->unref(buf);
	path->base = 0;
}